

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

uint32_t __thiscall olc::PixelGameEngine::CreateLayer(PixelGameEngine *this)

{
  pointer pLVar1;
  pointer pLVar2;
  Sprite *this_00;
  value_type local_78;
  
  local_78.vOffset.x = 0.0;
  local_78.vOffset.y = 0.0;
  local_78.vScale.x = 1.0;
  local_78.vScale.y = 1.0;
  local_78.bShow = false;
  local_78.bUpdate = false;
  local_78.pDrawTarget = (Sprite *)0x0;
  local_78.nResID = 0;
  local_78.vecDecalInstance.
  super__Vector_base<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.vecDecalInstance.
  super__Vector_base<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.vecDecalInstance.
  super__Vector_base<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.tint.field_0 = WHITE;
  local_78.funcHook.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_78.funcHook.super__Function_base._M_functor._8_8_ = 0;
  local_78.funcHook.super__Function_base._M_manager = (_Manager_type)0x0;
  local_78.funcHook._M_invoker = (_Invoker_type)0x0;
  this_00 = (Sprite *)operator_new(0x18);
  Sprite::Sprite(this_00,(this->vScreenSize).x,(this->vScreenSize).y);
  local_78.pDrawTarget = this_00;
  local_78.nResID =
       (**(code **)(*renderer + 0x48))(renderer,(this->vScreenSize).x,(this->vScreenSize).y);
  (**(code **)(*renderer + 0x50))(renderer,local_78.nResID,local_78.pDrawTarget);
  std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::push_back(&this->vLayers,&local_78);
  pLVar1 = (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar2 = (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  LayerDesc::~LayerDesc(&local_78);
  return (int)(((long)pLVar1 - (long)pLVar2) / 0x68) - 1;
}

Assistant:

v2d_generic(T _x, T _y) : x(_x), y(_y) {}